

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominance.cpp
# Opt level: O0

bool __thiscall mocker::DominatorTree::isDominating(DominatorTree *this,size_t u,size_t v)

{
  bool bVar1;
  mapped_type *s;
  size_t local_20;
  size_t v_local;
  size_t u_local;
  DominatorTree *this_local;
  
  local_20 = v;
  v_local = u;
  u_local = (size_t)this;
  s = std::
      unordered_map<unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
      ::at(&this->dominating,&v_local);
  bVar1 = isIn<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,unsigned_long>
                    (s,&local_20);
  return bVar1;
}

Assistant:

bool DominatorTree::isDominating(std::size_t u, std::size_t v) const {
  return isIn(dominating.at(u), v);
}